

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpdir_nonblock.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  size_t sStack_290;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  sockaddr_in sin;
  char mem [512];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
      sftppath = argv[4];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket!\n",0x19,1,_stderr);
    goto LAB_00101556;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 != 0) {
      libssh2_session_set_blocking(lVar5,0);
      do {
        uVar3 = libssh2_session_handshake(lVar5,__fd);
      } while (uVar3 == 0xffffffdb);
      if (uVar3 == 0) {
        lVar6 = libssh2_hostkey_hash(lVar5,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        for (lVar10 = 0; lVar10 != 0x14; lVar10 = lVar10 + 1) {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar10));
        }
        fputc(10,_stderr);
        do {
          pcVar9 = username;
          sVar7 = strlen(username);
          pcVar1 = password;
          sVar8 = strlen(password);
          iVar4 = libssh2_userauth_password_ex
                            (lVar5,pcVar9,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
        } while (iVar4 == -0x25);
        if (iVar4 == 0) {
          fwrite("libssh2_sftp_init()!\n",0x15,1,_stderr);
          do {
            lVar6 = libssh2_sftp_init(lVar5);
            if (lVar6 != 0) {
              fwrite("libssh2_sftp_opendir()!\n",0x18,1,_stderr);
              goto LAB_001015aa;
            }
            iVar4 = libssh2_session_last_errno(lVar5);
          } while (iVar4 == -0x25);
          pcVar9 = "Unable to init SFTP session\n";
          sStack_290 = 0x1c;
        }
        else {
          pcVar9 = "Authentication by password failed!\n";
          sStack_290 = 0x23;
        }
        goto LAB_0010151b;
      }
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
      goto LAB_00101524;
    }
    pcVar9 = "Could not initialize SSH session!\n";
    sStack_290 = 0x22;
  }
  else {
    pcVar9 = "failed to connect!\n";
    sStack_290 = 0x13;
  }
  fwrite(pcVar9,sStack_290,1,_stderr);
LAB_00101545:
  shutdown(__fd,2);
  close(__fd);
LAB_00101556:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
LAB_001015aa:
  pcVar9 = sftppath;
  sVar7 = strlen(sftppath);
  lVar10 = libssh2_sftp_open_ex(lVar6,pcVar9,sVar7 & 0xffffffff,0,0,1);
  if (lVar10 == 0) goto code_r0x001015d3;
  fwrite("libssh2_sftp_opendir() is done, now receive listing!\n",0x35,1,_stderr);
  while( true ) {
    do {
      iVar4 = libssh2_sftp_readdir_ex(lVar10,mem,0x200,0,0,&attrs);
    } while (iVar4 == -0x25);
    if (iVar4 < 1) break;
    pcVar9 = "--fix----- ";
    if (((byte)attrs.flags & 4) == 0) {
      pcVar9 = "---------- ";
    }
    printf(pcVar9);
    if (((byte)attrs.flags & 2) == 0) {
      printf("   -    - ");
    }
    else {
      printf("%4d %4d ",(ulong)(uint)attrs.uid,(ulong)(uint)attrs.gid);
    }
    if (((byte)attrs.flags & 1) != 0) {
      printf("%8llu ",attrs.filesize);
    }
    puts(mem);
  }
  libssh2_sftp_close_handle(lVar10);
  libssh2_sftp_shutdown(lVar6);
  goto LAB_00101524;
code_r0x001015d3:
  iVar4 = libssh2_session_last_errno(lVar5);
  if (iVar4 != -0x25) goto code_r0x001015e0;
  goto LAB_001015aa;
code_r0x001015e0:
  pcVar9 = "Unable to open dir with SFTP\n";
  sStack_290 = 0x1d;
LAB_0010151b:
  fwrite(pcVar9,sStack_290,1,_stderr);
LAB_00101524:
  socket((int)lVar5,0xb,0x1021aa);
  libssh2_session_free(lVar5);
  goto LAB_00101545;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        while((rc = libssh2_userauth_publickey_fromfile(session, username,
                                                        pubkey, privkey,
                                                        password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    do {
        sftp_session = libssh2_sftp_init(session);

        if(!sftp_session &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to init SFTP session\n");
            goto shutdown;
        }
    } while(!sftp_session);

    fprintf(stderr, "libssh2_sftp_opendir()!\n");
    /* Request a dir listing via SFTP */
    do {
        sftp_handle = libssh2_sftp_opendir(sftp_session, sftppath);

        if(!sftp_handle &&
           libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
            fprintf(stderr, "Unable to open dir with SFTP\n");
            goto shutdown;
        }
    } while(!sftp_handle);

    fprintf(stderr, "libssh2_sftp_opendir() is done, now receive listing!\n");
    do {
        char mem[512];
        LIBSSH2_SFTP_ATTRIBUTES attrs;

        /* loop until we fail */
        while((rc = libssh2_sftp_readdir(sftp_handle, mem, sizeof(mem),
                                         &attrs)) == LIBSSH2_ERROR_EAGAIN);
        if(rc > 0) {
            /* rc is the length of the file name in the mem
               buffer */

            if(attrs.flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
                /* this should check what permissions it
                   is and print the output accordingly */
                printf("--fix----- ");
            }
            else {
                printf("---------- ");
            }

            if(attrs.flags & LIBSSH2_SFTP_ATTR_UIDGID) {
                printf("%4d %4d ", (int) attrs.uid, (int) attrs.gid);
            }
            else {
                printf("   -    - ");
            }

            if(attrs.flags & LIBSSH2_SFTP_ATTR_SIZE) {
                printf("%8" __FILESIZE " ", attrs.filesize);
            }

            printf("%s\n", mem);
        }
        else if(rc == LIBSSH2_ERROR_EAGAIN) {
            /* blocking */
            fprintf(stderr, "Blocking\n");
        }
        else {
            break;
        }

    } while(1);

    libssh2_sftp_closedir(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}